

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

DiyFp __thiscall FIX::double_conversion::Single::AsDiyFp(Single *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  DiyFp DVar4;
  Single *this_local;
  undefined4 local_10;
  
  iVar2 = Sign(this);
  if (iVar2 < 1) {
    __assert_fail("Sign() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                  ,0x117,"DiyFp FIX::double_conversion::Single::AsDiyFp() const");
  }
  bVar1 = IsSpecial(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsSpecial()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                  ,0x118,"DiyFp FIX::double_conversion::Single::AsDiyFp() const");
  }
  uVar3 = Significand(this);
  iVar2 = Exponent(this);
  DiyFp::DiyFp((DiyFp *)&this_local,(ulong)uVar3,iVar2);
  DVar4._12_4_ = 0;
  DVar4.f_ = (uint64_t)this_local;
  DVar4.e_ = local_10;
  return DVar4;
}

Assistant:

DiyFp AsDiyFp() const {
    ASSERT(Sign() > 0);
    ASSERT(!IsSpecial());
    return DiyFp(Significand(), Exponent());
  }